

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

ImportDefinition * __thiscall
flatbuffers::ts::TsGenerator::AddImport<flatbuffers::StructDef>
          (ImportDefinition *__return_storage_ptr__,TsGenerator *this,import_set *imports,
          Definition *dependent,StructDef *dependency)

{
  IdlNamer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Namespace *pNVar4;
  ImportDefinition *pIVar5;
  StructDef *pSVar6;
  TsGenerator *this_01;
  map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
  *this_02;
  Namer *pNVar7;
  bool force_ns_wrap;
  iterator iVar8;
  long *plVar9;
  pointer pbVar10;
  undefined8 *puVar11;
  size_type *psVar12;
  pointer pbVar13;
  ulong *puVar14;
  long *plVar15;
  string *psVar16;
  char *pcVar17;
  ulong uVar18;
  string import_extension;
  string rel_file_path;
  string bare_file_path;
  string name;
  string symbols_expression;
  string object_name;
  string import_name;
  string unique_name;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  string local_2a8;
  ImportDefinition *local_288;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 *local_240;
  undefined8 local_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  StructDef *local_220;
  TsGenerator *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  long *local_1d0 [2];
  long local_1c0 [2];
  map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
  *local_1b0;
  Namer *local_1a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
  local_1a0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->namer_;
  IdlNamer::NamespacedType_abi_cxx11_(&local_50,this_00,&dependency->super_Definition);
  iVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
          ::find(imports,&local_50);
  if ((_Rb_tree_header *)iVar8._M_node != &(imports->_M_t)._M_impl.super__Rb_tree_header) {
    anon_unknown_10::ImportDefinition::ImportDefinition
              (__return_storage_ptr__,(ImportDefinition *)(iVar8._M_node + 2));
    goto LAB_00245027;
  }
  local_288 = __return_storage_ptr__;
  local_218 = this;
  local_1a8 = &this_00->super_Namer;
  (*(this_00->super_Namer)._vptr_Namer[0xf])(&local_70,this_00,dependency);
  force_ns_wrap = CheckIfNameClashes(imports,&local_70);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar16 = &local_50;
  if (!force_ns_wrap) {
    psVar16 = &local_70;
  }
  pcVar3 = (psVar16->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar3,pcVar3 + psVar16->_M_string_length);
  this_01 = local_218;
  GetTypeName_abi_cxx11_(&local_90,local_218,dependency,true,force_ns_wrap);
  local_220 = dependency;
  local_1b0 = (map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
               *)imports;
  GenSymbolExpression(&local_b0,this_01,dependency,force_ns_wrap,&local_70,&local_1f0,&local_90);
  local_240 = &local_230;
  local_238 = 0;
  local_230 = 0;
  local_260 = &local_250;
  local_258 = 0;
  local_250 = 0;
  pNVar4 = dependent->defined_namespace;
  pbVar10 = (pNVar4->components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (pNVar4->components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 != pbVar10) {
    paVar2 = &local_1a0.first.field_2;
    uVar18 = 0;
    do {
      if (uVar18 == 0) {
        local_1a0.first._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"..","");
      }
      else {
        local_1d0[0] = local_1c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"..","");
        plVar9 = (long *)std::__cxx11::string::insert((ulong)local_1d0,0,'\x01');
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_1a0.first.field_2._M_allocated_capacity = *psVar12;
          local_1a0.first.field_2._8_8_ = plVar9[3];
          local_1a0.first._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a0.first.field_2._M_allocated_capacity = *psVar12;
          local_1a0.first._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_1a0.first._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
      }
      std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_1a0.first._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a0.first._M_dataplus._M_p,
                        local_1a0.first.field_2._M_allocated_capacity + 1);
      }
      if ((uVar18 != 0) && (local_1d0[0] != local_1c0)) {
        operator_delete(local_1d0[0],local_1c0[0] + 1);
      }
      uVar18 = uVar18 + 1;
      pbVar10 = (pNVar4->components).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar13 = (pNVar4->components).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar18 < (ulong)((long)pbVar13 - (long)pbVar10 >> 5));
  }
  pSVar6 = local_220;
  pIVar5 = local_288;
  if (pbVar13 == pbVar10) {
    std::__cxx11::string::append((char *)&local_260);
  }
  pNVar7 = local_1a8;
  Namer::Directories(&local_2a8,local_1a8,
                     &((pSVar6->super_Definition).defined_namespace)->components,OutputPath,
                     kUpperCamel);
  plVar9 = (long *)std::__cxx11::string::insert((ulong)&local_2a8,0,'\x01');
  puVar14 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar14) {
    local_2b8 = *puVar14;
    uStack_2b0 = (undefined4)plVar9[3];
    uStack_2ac = *(undefined4 *)((long)plVar9 + 0x1c);
    local_2c8 = &local_2b8;
  }
  else {
    local_2b8 = *puVar14;
    local_2c8 = (ulong *)*plVar9;
  }
  local_2c0 = plVar9[1];
  *plVar9 = (long)puVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  (*pNVar7->_vptr_Namer[0xc])(&local_2e8,pNVar7,pSVar6,3);
  uVar18 = 0xf;
  if (local_2c8 != &local_2b8) {
    uVar18 = local_2b8;
  }
  if (uVar18 < (ulong)(local_2e0 + local_2c0)) {
    uVar18 = 0xf;
    if (local_2e8 != &local_2d8) {
      uVar18 = local_2d8;
    }
    if (uVar18 < (ulong)(local_2e0 + local_2c0)) goto LAB_002447b1;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_2c8);
  }
  else {
LAB_002447b1:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_2e8);
  }
  local_1a0.first._M_dataplus._M_p = (pointer)&local_1a0.first.field_2;
  psVar12 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1a0.first.field_2._M_allocated_capacity = *psVar12;
    local_1a0.first.field_2._8_8_ = puVar11[3];
  }
  else {
    local_1a0.first.field_2._M_allocated_capacity = *psVar12;
    local_1a0.first._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_1a0.first._M_string_length = puVar11[1];
  *puVar11 = psVar12;
  puVar11[1] = 0;
  *(undefined1 *)psVar12 = 0;
  std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1a0.first._M_dataplus._M_p);
  paVar2 = &local_1a0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0.first._M_dataplus._M_p,
                    local_1a0.first.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  paVar1 = &local_2a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_240);
  (pIVar5->name)._M_dataplus._M_p = (pointer)&(pIVar5->name).field_2;
  (pIVar5->name)._M_string_length = 0;
  (pIVar5->name).field_2._M_local_buf[0] = '\0';
  (pIVar5->import_statement)._M_dataplus._M_p = (pointer)&(pIVar5->import_statement).field_2;
  (pIVar5->import_statement)._M_string_length = 0;
  (pIVar5->import_statement).field_2._M_local_buf[0] = '\0';
  (pIVar5->export_statement)._M_dataplus._M_p = (pointer)&(pIVar5->export_statement).field_2;
  (pIVar5->export_statement)._M_string_length = 0;
  (pIVar5->export_statement).field_2._M_local_buf[0] = '\0';
  (pIVar5->bare_file_path)._M_dataplus._M_p = (pointer)&(pIVar5->bare_file_path).field_2;
  (pIVar5->bare_file_path)._M_string_length = 0;
  (pIVar5->bare_file_path).field_2._M_local_buf[0] = '\0';
  (pIVar5->rel_file_path)._M_dataplus._M_p = (pointer)&(pIVar5->rel_file_path).field_2;
  (pIVar5->rel_file_path)._M_string_length = 0;
  (pIVar5->rel_file_path).field_2._M_local_buf[0] = '\0';
  (pIVar5->object_name)._M_dataplus._M_p = (pointer)&(pIVar5->object_name).field_2;
  (pIVar5->object_name)._M_string_length = 0;
  (pIVar5->object_name).field_2._M_local_buf[0] = '\0';
  pIVar5->dependent = (Definition *)0x0;
  pIVar5->dependency = (Definition *)0x0;
  std::__cxx11::string::_M_assign((string *)pIVar5);
  std::__cxx11::string::_M_assign((string *)&pIVar5->object_name);
  std::__cxx11::string::_M_assign((string *)&pIVar5->bare_file_path);
  std::__cxx11::string::_M_assign((string *)&pIVar5->rel_file_path);
  uVar18 = (ulong)(((local_218->super_BaseGenerator).parser_)->opts).ts_no_import_ext;
  pcVar17 = ".js";
  if (uVar18 != 0) {
    pcVar17 = "";
  }
  local_2c8 = &local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,pcVar17,pcVar17 + (uVar18 ^ 1) * 3);
  std::operator+(&local_210,"import { ",&local_b0);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_210);
  plVar15 = plVar9 + 2;
  if ((long *)*plVar9 == plVar15) {
    local_270 = *plVar15;
    lStack_268 = plVar9[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar15;
    local_280 = (long *)*plVar9;
  }
  local_278 = plVar9[1];
  *plVar9 = (long)plVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_260);
  puVar14 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar14) {
    local_2d8 = *puVar14;
    lStack_2d0 = plVar9[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *puVar14;
    local_2e8 = (ulong *)*plVar9;
  }
  local_2e0 = plVar9[1];
  *plVar9 = (long)puVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_2c8);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2a8.field_2._M_allocated_capacity = *psVar12;
    local_2a8.field_2._8_8_ = plVar9[3];
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar12;
    local_2a8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2a8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1a0.first.field_2._M_allocated_capacity = *psVar12;
    local_1a0.first.field_2._8_8_ = plVar9[3];
    local_1a0.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a0.first.field_2._M_allocated_capacity = *psVar12;
    local_1a0.first._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1a0.first._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)&pIVar5->import_statement,(string *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0.first._M_dataplus._M_p,
                    local_1a0.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_210,"export { ",&local_b0);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_210);
  plVar15 = plVar9 + 2;
  if ((long *)*plVar9 == plVar15) {
    local_270 = *plVar15;
    lStack_268 = plVar9[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar15;
    local_280 = (long *)*plVar9;
  }
  local_278 = plVar9[1];
  *plVar9 = (long)plVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_240);
  puVar14 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar14) {
    local_2d8 = *puVar14;
    lStack_2d0 = plVar9[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *puVar14;
    local_2e8 = (ulong *)*plVar9;
  }
  local_2e0 = plVar9[1];
  *plVar9 = (long)puVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_2c8);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2a8.field_2._M_allocated_capacity = *psVar12;
    local_2a8.field_2._8_8_ = plVar9[3];
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar12;
    local_2a8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2a8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1a0.first.field_2._M_allocated_capacity = *psVar12;
    local_1a0.first.field_2._8_8_ = plVar9[3];
    local_1a0.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a0.first.field_2._M_allocated_capacity = *psVar12;
    local_1a0.first._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1a0.first._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_288->export_statement,(string *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0.first._M_dataplus._M_p,
                    local_1a0.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  this_02 = local_1b0;
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  pSVar6 = local_220;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__ = local_288;
  local_288->dependency = &pSVar6->super_Definition;
  local_288->dependent = dependent;
  std::make_pair<std::__cxx11::string_const&,flatbuffers::(anonymous_namespace)::ImportDefinition&>
            (&local_1a0,&local_50,local_288);
  std::
  map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
  ::insert<std::pair<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition>>
            (this_02,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.second.object_name._M_dataplus._M_p != &local_1a0.second.object_name.field_2) {
    operator_delete(local_1a0.second.object_name._M_dataplus._M_p,
                    local_1a0.second.object_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.second.rel_file_path._M_dataplus._M_p != &local_1a0.second.rel_file_path.field_2)
  {
    operator_delete(local_1a0.second.rel_file_path._M_dataplus._M_p,
                    local_1a0.second.rel_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.second.bare_file_path._M_dataplus._M_p !=
      &local_1a0.second.bare_file_path.field_2) {
    operator_delete(local_1a0.second.bare_file_path._M_dataplus._M_p,
                    local_1a0.second.bare_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.second.export_statement._M_dataplus._M_p !=
      &local_1a0.second.export_statement.field_2) {
    operator_delete(local_1a0.second.export_statement._M_dataplus._M_p,
                    local_1a0.second.export_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.second.import_statement._M_dataplus._M_p !=
      &local_1a0.second.import_statement.field_2) {
    operator_delete(local_1a0.second.import_statement._M_dataplus._M_p,
                    local_1a0.second.import_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.second.name._M_dataplus._M_p != &local_1a0.second.name.field_2) {
    operator_delete(local_1a0.second.name._M_dataplus._M_p,
                    local_1a0.second.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0.first._M_dataplus._M_p,
                    local_1a0.first.field_2._M_allocated_capacity + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_00245027:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ImportDefinition AddImport(import_set &imports, const Definition &dependent,
                             const DefinitionT &dependency) {
    // The unique name of the dependency, fully qualified in its namespace.
    const std::string unique_name = GetTypeName(
        dependency, /*object_api = */ false, /*force_ns_wrap=*/true);

    // Look if we have already added this import and return its name if found.
    const auto import_pair = imports.find(unique_name);
    if (import_pair != imports.end()) { return import_pair->second; }

    // Check if this name would have a name clash with another type. Just use
    // the "base" name (properly escaped) without any namespacing applied.
    const std::string import_name = GetTypeName(dependency);
    const bool has_name_clash = CheckIfNameClashes(imports, import_name);

    // If we have a name clash, use the unique name, otherwise use simple name.
    std::string name = has_name_clash ? unique_name : import_name;

    const std::string object_name =
        GetTypeName(dependency, /*object_api=*/true, has_name_clash);

    const std::string symbols_expression = GenSymbolExpression(
        dependency, has_name_clash, import_name, name, object_name);

    std::string bare_file_path;
    std::string rel_file_path;
    const auto &dep_comps = dependent.defined_namespace->components;
    for (size_t i = 0; i < dep_comps.size(); i++) {
      rel_file_path += i == 0 ? ".." : (kPathSeparator + std::string(".."));
    }
    if (dep_comps.size() == 0) { rel_file_path += "."; }

    bare_file_path +=
        kPathSeparator +
        namer_.Directories(dependency.defined_namespace->components,
                           SkipDir::OutputPath) +
        namer_.File(dependency, SkipFile::SuffixAndExtension);
    rel_file_path += bare_file_path;

    ImportDefinition import;
    import.name = name;
    import.object_name = object_name;
    import.bare_file_path = bare_file_path;
    import.rel_file_path = rel_file_path;
    std::string import_extension = parser_.opts.ts_no_import_ext ? "" : ".js";
    import.import_statement = "import { " + symbols_expression + " } from '" +
                              rel_file_path + import_extension + "';";
    import.export_statement = "export { " + symbols_expression + " } from '." +
                              bare_file_path + import_extension + "';";
    import.dependency = &dependency;
    import.dependent = &dependent;

    imports.insert(std::make_pair(unique_name, import));

    return import;
  }